

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall
Assimp::IFC::Schema_2x3::IfcFurnitureStandard::~IfcFurnitureStandard(IfcFurnitureStandard *this)

{
  ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL> *pOVar1;
  undefined1 *puVar2;
  undefined1 *puVar3;
  
  *(undefined8 *)&this[-1].super_IfcControl.super_IfcObject.field_0x28 = 0x91ddd8;
  *(undefined8 *)&(this->super_IfcControl).super_IfcObject.field_0x10 = 0x91de50;
  *(undefined8 *)
   &this[-1].super_IfcControl.super_IfcObject.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>.field_0x18 = 0x91de00;
  *(undefined8 *)&this[-1].super_IfcControl.super_IfcObject.field_0xc0 = 0x91de28;
  puVar3 = *(undefined1 **)&this[-1].super_IfcControl.super_IfcObject.field_0xd0;
  puVar2 = &this[-1].super_IfcControl.super_IfcObject.field_0xe0;
  if (puVar3 != puVar2) {
    operator_delete(puVar3,*(long *)puVar2 + 1);
  }
  *(undefined8 *)&this[-1].super_IfcControl.super_IfcObject.field_0x28 = 0x91def0;
  *(undefined8 *)&(this->super_IfcControl).super_IfcObject.field_0x10 = 0x91df18;
  puVar2 = *(undefined1 **)&this[-1].super_IfcControl.super_IfcObject.field_0x88;
  pOVar1 = &this[-1].super_IfcControl.super_IfcObject.
            super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>;
  if ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL> *)puVar2 != pOVar1) {
    operator_delete(puVar2,(long)pOVar1->_vptr_ObjectHelper + 1);
  }
  puVar3 = *(undefined1 **)&this[-1].super_IfcControl.super_IfcObject.field_0x60;
  puVar2 = &this[-1].super_IfcControl.super_IfcObject.field_0x70;
  if (puVar3 != puVar2) {
    operator_delete(puVar3,*(long *)puVar2 + 1);
  }
  puVar2 = *(undefined1 **)&this[-1].super_IfcControl.super_IfcObject.field_0x38;
  puVar3 = &this[-1].super_IfcControl.super_IfcObject.field_0x48;
  if (puVar2 != puVar3) {
    operator_delete(puVar2,*(long *)puVar3 + 1);
  }
  operator_delete(&this[-1].super_IfcControl.super_IfcObject.field_0x28,0x108);
  return;
}

Assistant:

IfcFurnitureStandard() : Object("IfcFurnitureStandard") {}